

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::FieldOptions_EditionDefault::_InternalSerialize
          (FieldOptions_EditionDefault *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  anon_union_24_1_493b367e_for_FieldOptions_EditionDefault_3 aVar2;
  uint8_t *puVar3;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  char *in_R9;
  undefined8 *puVar7;
  string_view s;
  string_view field_name;
  
  aVar2 = this->field_0;
  if (((undefined1  [24])aVar2 & (undefined1  [24])0x1) != (undefined1  [24])0x0) {
    puVar7 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"google.protobuf.FieldOptions.EditionDefault.value";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar7,(char *)(ulong)*(uint *)(puVar7 + 1),1,0x31,field_name);
    s._M_str = (char *)*puVar7;
    s._M_len = puVar7[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,s,target);
  }
  if (((undefined1  [24])aVar2 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar5 = (ulong)(this->field_0)._impl_.edition_;
    pbVar4 = target + 1;
    *target = 0x18;
    uVar6 = uVar5;
    if (0x7f < uVar5) {
      do {
        *pbVar4 = (byte)uVar6 | 0x80;
        uVar5 = uVar6 >> 7;
        pbVar4 = pbVar4 + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar5;
      } while (bVar1);
    }
    *pbVar4 = (byte)uVar5;
    target = pbVar4 + 1;
  }
  uVar6 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    puVar3 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar6 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar3;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL FieldOptions_EditionDefault::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const FieldOptions_EditionDefault& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FieldOptions.EditionDefault)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string value = 2;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_value();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FieldOptions.EditionDefault.value");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // optional .google.protobuf.Edition edition = 3;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        3, this_._internal_edition(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FieldOptions.EditionDefault)
  return target;
}